

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::ZipDatabase::read_entry
          (ZipDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  bool bVar1;
  mz_bool mVar2;
  LogLevel LVar3;
  iterator iVar4;
  Hash local_28;
  
  if ((flags & 1) == 0) {
    if (this->alive != true) {
      return false;
    }
    if (this->mode != ReadOnly) {
      return false;
    }
    local_28 = hash;
    iVar4 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->seen_blobs[tag]._M_h,&local_28);
    if (blob_size != (size_t *)0x0 &&
        iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
        ._M_cur != (__node_type *)0x0) {
      if (blob == (void *)0x0) {
        *blob_size = *(size_t *)
                      ((long)iVar4.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                             ._M_cur + 0x18);
        return true;
      }
      if (*(ulong *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                           ._M_cur + 0x18) <= *blob_size) {
        *blob_size = *(ulong *)((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                                      ._M_cur + 0x18);
        mVar2 = mz_zip_reader_extract_to_mem
                          (&this->mz,
                           *(mz_uint *)
                            ((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                                   ._M_cur + 0x10),blob,
                           *(size_t *)
                            ((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                                   ._M_cur + 0x18),0);
        if (mVar2 != 0) {
          return true;
        }
        LVar3 = get_thread_log_level();
        if ((int)LVar3 < 3) {
          bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to extract blob.\n");
          if (bVar1) {
            return false;
          }
          read_entry();
        }
      }
    }
  }
  return false;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (!alive || mode != DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr == end(seen_blobs[tag]))
			return false;

		if (!blob_size)
			return false;

		if (blob && *blob_size < itr->second.size)
			return false;
		*blob_size = itr->second.size;

		if (blob)
		{
			if (!mz_zip_reader_extract_to_mem(&mz, itr->second.index, blob, itr->second.size, 0))
			{
				LOGE_LEVEL("Failed to extract blob.\n");
				return false;
			}
		}

		return true;
	}